

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.cpp
# Opt level: O2

hugeint_t __thiscall
duckdb::Hugeint::DivModPositive(Hugeint *this,hugeint_t lhs,uint64_t rhs,uint64_t *remainder)

{
  byte bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  Hugeint *pHVar8;
  hugeint_t hVar9;
  
  *(undefined8 *)rhs = 0;
  bVar1 = PositiveHugeintHighestBit((duckdb *)this,lhs);
  uVar5 = 0;
  uVar4 = 0;
  uVar2 = 0;
  for (uVar3 = (ulong)bVar1; uVar3 != 0; uVar3 = uVar3 - 1) {
    uVar7 = uVar2 * 2;
    pHVar8 = (Hugeint *)lhs.lower;
    if (uVar3 < 0x41) {
      pHVar8 = this;
    }
    uVar5 = (ulong)(((ulong)pHVar8 >> ((ulong)((int)uVar3 - 1U & 0xff) & 0x3f) & 1) != 0) +
            uVar5 * 2;
    *(ulong *)rhs = uVar5;
    uVar6 = uVar5 - lhs.upper;
    if ((ulong)lhs.upper <= uVar5) {
      *(ulong *)rhs = uVar6;
      uVar7 = uVar7 | 1;
      uVar5 = uVar6;
    }
    uVar4 = uVar4 << 1 | uVar2 >> 0x3f;
    uVar2 = uVar7;
  }
  hVar9.upper = uVar4;
  hVar9.lower = uVar2;
  return hVar9;
}

Assistant:

hugeint_t Hugeint::DivModPositive(hugeint_t lhs, uint64_t rhs, uint64_t &remainder) {
	D_ASSERT(lhs.upper >= 0);
	// DivMod code adapted from:
	// https://github.com/calccrypto/uint128_t/blob/master/uint128_t.cpp

	// initialize the result and remainder to 0
	hugeint_t div_result;
	div_result.lower = 0;
	div_result.upper = 0;
	remainder = 0;

	uint8_t highest_bit_set = PositiveHugeintHighestBit(lhs);
	// now iterate over the amount of bits that are set in the LHS
	for (uint8_t x = highest_bit_set; x > 0; x--) {
		// left-shift the current result and remainder by 1
		div_result = PositiveHugeintLeftShift(div_result, 1);
		remainder <<= 1;
		// we get the value of the bit at position X, where position 0 is the least-significant bit
		if (PositiveHugeintIsBitSet(lhs, x - 1)) {
			// increment the remainder
			remainder++;
		}
		if (remainder >= rhs) {
			// the remainder has passed the division multiplier: add one to the divide result
			remainder -= rhs;
			div_result.lower++;
			if (div_result.lower == 0) {
				// overflow
				div_result.upper++;
			}
		}
	}
	return div_result;
}